

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_dynamic.hpp
# Opt level: O1

Elf_Xword __thiscall
ELFIO::dynamic_section_accessor_template<ELFIO::section>::get_entries_num
          (dynamic_section_accessor_template<ELFIO::section> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_ELFIO::elf_header_*,_false> _Var2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar5;
  Elf_Xword index;
  ulong uVar6;
  Elf_Xword tag;
  Elf_Xword value;
  string str;
  Elf_Xword local_60 [2];
  string local_50;
  
  _Var2._M_head_impl =
       (this->elf_file->header)._M_t.
       super___uniq_ptr_impl<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>._M_t.
       super__Tuple_impl<0UL,_ELFIO::elf_header_*,_std::default_delete<ELFIO::elf_header>_>.
       super__Head_base<0UL,_ELFIO::elf_header_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (elf_header *)0x0) {
    uVar6 = 0x10;
  }
  else {
    iVar3 = (*(_Var2._M_head_impl)->_vptr_elf_header[4])();
    uVar6 = (ulong)((char)iVar3 != '\x01') * 8 + 8;
  }
  if (this->entries_num == 0) {
    iVar3 = (*this->dynamic_section->_vptr_section[0xf])();
    if (CONCAT44(extraout_var,iVar3) != 0) {
      iVar3 = (*this->dynamic_section->_vptr_section[0xf])();
      if (uVar6 <= CONCAT44(extraout_var_00,iVar3)) {
        iVar3 = (*this->dynamic_section->_vptr_section[0x13])();
        iVar4 = (*this->dynamic_section->_vptr_section[0xf])();
        this->entries_num = CONCAT44(extraout_var_01,iVar3) / CONCAT44(extraout_var_02,iVar4);
        local_60[0] = 0;
        local_60[1] = 0;
        paVar1 = &local_50.field_2;
        local_50._M_string_length = 0;
        local_50.field_2._M_local_buf[0] = '\0';
        local_50._M_dataplus._M_p = (pointer)paVar1;
        if (this->entries_num == 0) {
          uVar6 = 1;
        }
        else {
          index = 0;
          do {
            get_entry(this,index,local_60,local_60 + 1,&local_50);
            if (local_60[0] == 0) break;
            index = index + 1;
          } while (index < this->entries_num);
          uVar6 = index + 1;
        }
        uVar5 = this->entries_num;
        if (uVar6 < this->entries_num) {
          uVar5 = uVar6;
        }
        this->entries_num = uVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != paVar1) {
          operator_delete(local_50._M_dataplus._M_p,
                          CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                   local_50.field_2._M_local_buf[0]) + 1);
        }
      }
    }
  }
  return this->entries_num;
}

Assistant:

Elf_Xword get_entries_num() const
    {
        size_t needed_entry_size = -1;
        if ( elf_file.get_class() == ELFCLASS32 ) {
            needed_entry_size = sizeof( Elf32_Dyn );
        }
        else {
            needed_entry_size = sizeof( Elf64_Dyn );
        }

        if ( ( 0 == entries_num ) &&
             ( 0 != dynamic_section->get_entry_size() &&
               dynamic_section->get_entry_size() >= needed_entry_size ) ) {
            entries_num =
                dynamic_section->get_size() / dynamic_section->get_entry_size();
            Elf_Xword   i;
            Elf_Xword   tag   = DT_NULL;
            Elf_Xword   value = 0;
            std::string str;
            for ( i = 0; i < entries_num; i++ ) {
                get_entry( i, tag, value, str );
                if ( tag == DT_NULL )
                    break;
            }
            entries_num = std::min<Elf_Xword>( entries_num, i + 1 );
        }

        return entries_num;
    }